

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ostream * __thiscall
parser::Parser::dotStringify(Parser *this,ostream *out,Grammar *grammar,CanonicalSet *canonicalSet)

{
  ulong uVar1;
  const_iterator cVar2;
  bool bVar3;
  ostream *poVar4;
  Situation *pSVar5;
  const_reference pvVar6;
  pointer pSVar7;
  size_type sVar8;
  pointer pSVar9;
  const_reference __x;
  reference grammaticSymbol;
  pointer pGVar10;
  pair<std::_Rb_tree_const_iterator<parser::GrammaticSymbol>,_bool> pVar11;
  string local_100;
  ulong local_e0;
  size_t j;
  Situations goToSits;
  _Self local_b8;
  iterator symbol;
  __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
  local_a0 [3];
  __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
  local_88;
  const_iterator situation;
  UniqueGrammaticSymbols uniqueGrammaticSymbols;
  size_t i_1;
  __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
  local_40;
  __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
  local_38;
  const_iterator sit;
  size_t i;
  CanonicalSet *canonicalSet_local;
  Grammar *grammar_local;
  ostream *out_local;
  Parser *this_local;
  
  poVar4 = std::operator<<(out,"digraph CanonicalSet {");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (sit._M_current = (Situation *)0x0; cVar2._M_current = sit._M_current,
      pSVar5 = (Situation *)
               std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::size
                         (canonicalSet), cVar2._M_current < pSVar5;
      sit._M_current =
           (Situation *)((long)&((sit._M_current)->super_Convolution)._vptr_Convolution + 1)) {
    poVar4 = std::operator<<(out,"I");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)sit._M_current);
    std::operator<<(poVar4,"[label=\"");
    pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                       (canonicalSet,(size_type)sit._M_current);
    local_38._M_current =
         (Situation *)
         std::vector<parser::Situation,_std::allocator<parser::Situation>_>::begin
                   (&pvVar6->situations);
    while( true ) {
      pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                         (canonicalSet,(size_type)sit._M_current);
      local_40._M_current =
           (Situation *)
           std::vector<parser::Situation,_std::allocator<parser::Situation>_>::end
                     (&pvVar6->situations);
      bVar3 = __gnu_cxx::operator!=(&local_38,&local_40);
      if (!bVar3) break;
      pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                         (canonicalSet,(size_type)sit._M_current);
      i_1 = (size_t)std::vector<parser::Situation,_std::allocator<parser::Situation>_>::begin
                              (&pvVar6->situations);
      bVar3 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                          *)&i_1);
      if (bVar3) {
        std::operator<<(out,"\n");
      }
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
               ::operator->(&local_38);
      (*(pSVar7->super_Convolution)._vptr_Convolution[1])
                (pSVar7,out,&this->terminalNames,&this->nonTerminalNames);
      __gnu_cxx::
      __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
      ::operator++(&local_38);
    }
    std::operator<<(out,"\"]\n");
  }
  for (uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      sVar8 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::size
                        (canonicalSet),
      uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count < sVar8;
      uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count =
           uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    std::
    set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
    ::set((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
           *)&situation);
    pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                       (canonicalSet,
                        uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_88._M_current =
         (Situation *)
         std::vector<parser::Situation,_std::allocator<parser::Situation>_>::begin
                   (&pvVar6->situations);
    while( true ) {
      pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                         (canonicalSet,
                          uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_a0[0]._M_current =
           (Situation *)
           std::vector<parser::Situation,_std::allocator<parser::Situation>_>::end
                     (&pvVar6->situations);
      bVar3 = __gnu_cxx::operator!=(&local_88,local_a0);
      if (!bVar3) break;
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
               ::operator->(&local_88);
      sVar8 = std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::size
                        (&(pSVar7->super_Convolution).body);
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
               ::operator->(&local_88);
      if (sVar8 != pSVar7->point) {
        pSVar7 = __gnu_cxx::
                 __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                 ::operator->(&local_88);
        pSVar9 = __gnu_cxx::
                 __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                 ::operator->(&local_88);
        __x = std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::at
                        (&(pSVar7->super_Convolution).body,pSVar9->point);
        pVar11 = std::
                 set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                 ::insert((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                           *)&situation,__x);
        symbol._M_node = (_Base_ptr)pVar11.first._M_node;
      }
      __gnu_cxx::
      __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
      ::operator++(&local_88);
    }
    local_b8._M_node =
         (_Base_ptr)
         std::
         set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
         ::begin((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                  *)&situation);
    while( true ) {
      goToSits.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                    ::end((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                           *)&situation);
      bVar3 = std::operator!=(&local_b8,
                              (_Self *)&goToSits.
                                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar3) break;
      pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                         (canonicalSet,
                          uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count);
      grammaticSymbol = std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator*(&local_b8);
      goTo((Situations *)&j,this,grammar,&pvVar6->situations,grammaticSymbol);
      for (local_e0 = 0; uVar1 = local_e0,
          sVar8 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::size
                            (canonicalSet), uVar1 < sVar8; local_e0 = local_e0 + 1) {
        pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                           (canonicalSet,local_e0);
        bVar3 = std::operator==((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&j,
                                &pvVar6->situations);
        if (bVar3) {
          poVar4 = std::operator<<(out,"I");
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             (poVar4,uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count);
          poVar4 = std::operator<<(poVar4," -> ");
          poVar4 = std::operator<<(poVar4,"I");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_e0);
          poVar4 = std::operator<<(poVar4," [label=\"");
          pGVar10 = std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator->(&local_b8);
          if ((pGVar10->isTerminal & 1U) == 0) {
            pGVar10 = std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator->(&local_b8);
            nonTerminalName(&local_100,pGVar10->value,&this->nonTerminalNames);
          }
          else {
            pGVar10 = std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator->(&local_b8);
            lexer::terminalName(&local_100,pGVar10->value,&this->terminalNames);
          }
          poVar4 = std::operator<<(poVar4,(string *)&local_100);
          poVar4 = std::operator<<(poVar4,"\"]");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_100);
        }
      }
      std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
                ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&j);
      std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator++(&local_b8);
    }
    std::
    set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
    ::~set((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
            *)&situation);
  }
  std::operator<<(out,"}");
  return out;
}

Assistant:

std::ostream& dotStringify(std::ostream& out, Grammar const& grammar,
                                   CanonicalSet const& canonicalSet) {
            out << "digraph CanonicalSet {" << std::endl;

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                out << "I" << i << "[label=\"";
                for_each_c(Situations, canonicalSet.at(i).situations, sit) {
                    if (sit != canonicalSet.at(i).situations.begin()) out  << "\n";
                    sit->stringify(out, terminalNames, nonTerminalNames);
                }
                out << "\"]\n";
            }

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                UniqueGrammaticSymbols uniqueGrammaticSymbols;
                for_each_c(Situations, canonicalSet.at(i).situations, situation) {
                    if (situation->body.size() == situation->point)
                        continue;
                    uniqueGrammaticSymbols.insert(situation->body.at(situation->point));
                }

                for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol) {
                    Situations goToSits = goTo(grammar, canonicalSet.at(i).situations, *symbol);

                    for (size_t j = 0; j < canonicalSet.size(); ++j) {
                        if (goToSits == canonicalSet.at(j).situations) {
                            out << "I" << i << " -> " << "I" << j << " [label=\""
                              << (symbol->isTerminal ? lexer::terminalName(symbol->value, terminalNames)
                                                     : nonTerminalName(symbol->value, nonTerminalNames)) << "\"]" << std::endl;
                        }
                    }
                }
            }
            out << "}";
            return out;
        }